

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

void EPSG_calc_stereo(EPSG *psg,UINT32 samples,DEV_SMPL **out)

{
  byte bVar1;
  short sVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  pDVar3 = *out;
  pDVar4 = out[1];
  if (psg->quality == 0) {
    if (samples != 0) {
      uVar10 = 0;
      do {
        update_output(psg);
        lVar6 = 0x5b;
        iVar7 = 0;
        iVar8 = 0;
        do {
          bVar1 = psg->reg[lVar6 + -0xb];
          if ((~bVar1 & 3) == 0) {
            iVar8 = iVar8 + (*(int *)((long)psg + lVar6 * 8 + -0x23c) *
                             (int)*(short *)(psg->reg + lVar6 * 2 + -0x10) >> 0x10);
            iVar9 = (int)*(short *)(psg->reg + lVar6 * 2 + -0x10) *
                    *(int *)((long)psg + lVar6 * 8 + -0x238) >> 0x10;
LAB_0015d7f0:
            iVar7 = iVar7 + iVar9;
          }
          else {
            if ((bVar1 & 1) != 0) {
              iVar8 = iVar8 + *(short *)(psg->reg + lVar6 * 2 + -0x10);
            }
            if ((bVar1 & 2) != 0) {
              iVar9 = (int)*(short *)(psg->reg + lVar6 * 2 + -0x10);
              goto LAB_0015d7f0;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x5e);
        pDVar3[uVar10] = iVar8;
        pDVar4[uVar10] = iVar7;
        uVar10 = uVar10 + 1;
      } while (uVar10 != samples);
    }
  }
  else if (samples != 0) {
    uVar10 = 0;
    do {
      while( true ) {
        uVar5 = psg->psgtime;
        if (psg->realstep <= uVar5) break;
        psg->psgtime = uVar5 + psg->psgstep;
        *(undefined8 *)psg->sprev = *(undefined8 *)psg->snext;
        update_output(psg);
        psg->snext[0] = 0;
        psg->snext[1] = 0;
        lVar6 = 0x5b;
        do {
          if ((~psg->reg[lVar6 + -0xb] & 3) == 0) {
            sVar2 = *(short *)(psg->reg + lVar6 * 2 + -0x10);
            psg->snext[0] =
                 psg->snext[0] + (*(int *)((long)psg + lVar6 * 8 + -0x23c) * (int)sVar2 >> 0x10);
            iVar7 = (int)sVar2 * *(int *)((long)psg + lVar6 * 8 + -0x238) >> 0x10;
LAB_0015d6be:
            psg->snext[1] = iVar7 + psg->snext[1];
          }
          else {
            if ((psg->reg[lVar6 + -0xb] & 1) != 0) {
              psg->snext[0] = psg->snext[0] + (int)*(short *)(psg->reg + lVar6 * 2 + -0x10);
            }
            if ((psg->reg[lVar6 + -0xb] & 2) != 0) {
              iVar7 = (int)*(short *)(psg->reg + lVar6 * 2 + -0x10);
              goto LAB_0015d6be;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x5e);
      }
      uVar5 = uVar5 - psg->realstep;
      psg->psgtime = uVar5;
      pDVar3[uVar10] =
           (int)(((double)uVar5 * (double)psg->sprev[0] +
                 (double)(psg->psgstep - uVar5) * (double)psg->snext[0]) / (double)psg->psgstep);
      pDVar4[uVar10] =
           (int)(((double)psg->psgtime * (double)psg->sprev[1] +
                 (double)(psg->psgstep - psg->psgtime) * (double)psg->snext[1]) /
                (double)psg->psgstep);
      uVar10 = uVar10 + 1;
    } while (uVar10 != samples);
  }
  return;
}

Assistant:

void
EPSG_calc_stereo (EPSG * psg, UINT32 samples, DEV_SMPL **out)
{
  DEV_SMPL *bufMO = out[0];
  DEV_SMPL *bufRO = out[1];
  int32_t buffers[2];
  UINT32 i;

  if (!psg->quality)
  {
    for (i = 0; i < samples; i ++)
    {
      update_output(psg);
      mix_output_stereo(psg, buffers);
      bufMO[i] = buffers[0];
      bufRO[i] = buffers[1];
    }
  }
  else
  {
    for (i = 0; i < samples; i ++)
    {
      while (psg->realstep > psg->psgtime)
      { 
        psg->psgtime += psg->psgstep;
        psg->sprev[0] = psg->snext[0];
        psg->sprev[1] = psg->snext[1];
        update_output(psg);
        mix_output_stereo(psg, psg->snext);
      }

      psg->psgtime -= psg->realstep;
      bufMO[i] = (DEV_SMPL) (((double) psg->snext[0] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[0] * psg->psgtime) / psg->psgstep);
      bufRO[i] = (DEV_SMPL) (((double) psg->snext[1] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[1] * psg->psgtime) / psg->psgstep);
    }
  }
}